

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_compressEnd(ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  ZSTD_compressionStage_e ZVar1;
  size_t err_code_1;
  size_t sVar2;
  size_t sVar3;
  unsigned_long_long uVar4;
  size_t err_code;
  ulong uVar5;
  size_t err_code_2;
  undefined4 *puVar6;
  undefined4 *dst_00;
  
  sVar2 = ZSTD_compressContinue_internal(cctx,dst,dstCapacity,src,srcSize,1,1);
  if (0xffffffffffffff88 < sVar2) {
    return sVar2;
  }
  ZVar1 = cctx->stage;
  if (ZVar1 == ZSTDcs_created) {
    return 0xffffffffffffffc4;
  }
  dst_00 = (undefined4 *)((long)dst + sVar2);
  uVar5 = dstCapacity - sVar2;
  puVar6 = dst_00;
  if (ZVar1 != ZSTDcs_ending) {
    if (ZVar1 == ZSTDcs_init) {
      sVar3 = ZSTD_writeFrameHeader(dst_00,uVar5,&cctx->appliedParams,0,0);
      if (0xffffffffffffff88 < sVar3) {
        return sVar3;
      }
      uVar5 = uVar5 - sVar3;
      cctx->stage = ZSTDcs_ongoing;
      puVar6 = (undefined4 *)(sVar3 + (long)dst_00);
    }
    if (uVar5 < 4) {
      return 0xffffffffffffffba;
    }
    *puVar6 = 1;
    uVar5 = uVar5 - 3;
    puVar6 = (undefined4 *)((long)puVar6 + 3);
  }
  if ((cctx->appliedParams).fParams.checksumFlag != 0) {
    if (uVar5 < 4) {
      return 0xffffffffffffffba;
    }
    uVar4 = ZSTD_XXH64_digest(&cctx->xxhState);
    *puVar6 = (int)uVar4;
    puVar6 = puVar6 + 1;
  }
  cctx->stage = ZSTDcs_created;
  uVar5 = (long)puVar6 - (long)dst_00;
  if (0xffffffffffffff88 < uVar5) {
    return uVar5;
  }
  uVar4 = cctx->pledgedSrcSizePlusOne;
  if ((cctx->appliedParams).fParams.contentSizeFlag == 0) {
    if (uVar4 == 0) goto LAB_0014ee1c;
  }
  else if (uVar4 == 0) {
    __assert_fail("!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x36bb,
                  "size_t ZSTD_compressEnd(ZSTD_CCtx *, void *, size_t, const void *, size_t)");
  }
  if (uVar4 != cctx->consumedSrcSize + 1) {
    return 0xffffffffffffffb8;
  }
LAB_0014ee1c:
  return uVar5 + sVar2;
}

Assistant:

size_t ZSTD_compressEnd (ZSTD_CCtx* cctx,
                         void* dst, size_t dstCapacity,
                   const void* src, size_t srcSize)
{
    size_t endResult;
    size_t const cSize = ZSTD_compressContinue_internal(cctx,
                                dst, dstCapacity, src, srcSize,
                                1 /* frame mode */, 1 /* last chunk */);
    FORWARD_IF_ERROR(cSize);
    endResult = ZSTD_writeEpilogue(cctx, (char*)dst + cSize, dstCapacity-cSize);
    FORWARD_IF_ERROR(endResult);
    assert(!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0));
    if (cctx->pledgedSrcSizePlusOne != 0) {  /* control src size */
        ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN == (unsigned long long)-1);
        DEBUGLOG(4, "end of frame : controlling src size");
        RETURN_ERROR_IF(
            cctx->pledgedSrcSizePlusOne != cctx->consumedSrcSize+1,
            srcSize_wrong,
             "error : pledgedSrcSize = %u, while realSrcSize = %u",
            (unsigned)cctx->pledgedSrcSizePlusOne-1,
            (unsigned)cctx->consumedSrcSize);
    }
    return cSize + endResult;
}